

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ConfidentialAssetId *
cfd::core::ConfidentialTransaction::CalculateAsset
          (ConfidentialAssetId *__return_storage_ptr__,BlindFactor *entropy)

{
  uchar *entropy_00;
  CfdException *this;
  uchar *bytes_out;
  size_type len;
  undefined8 uVar1;
  allocator_type *in_stack_fffffffffffffee0;
  string *message;
  size_type in_stack_fffffffffffffee8;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffef0;
  ByteData local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  int local_80 [2];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset;
  ByteData256 local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *entropy_byte;
  BlindFactor *entropy_local;
  
  entropy_byte = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)entropy;
  entropy_local = (BlindFactor *)__return_storage_ptr__;
  BlindFactor::GetData(&local_50,entropy);
  ByteData256::GetBytes(&local_38,&local_50);
  ByteData256::~ByteData256((ByteData256 *)0x4aefb3);
  local_20 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4aefcb);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4aefeb);
  entropy_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_20);
  this = (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_20);
  message = (string *)&ret;
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4af01b);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  local_80[0] = wally_tx_elements_issuance_calculate_asset(entropy_00,(size_t)this,bytes_out,len);
  error_code = (CfdError)((ulong)entropy_00 >> 0x20);
  if (local_80[0] != 0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x82e;
    local_98.funcname = "CalculateAsset";
    logger::warn<int&>(&local_98,"wally_tx_elements_issuance_calculate_asset NG[{}].",local_80);
    local_ba = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"asset calculate error.",&local_b9);
    CfdException::CfdException(this,error_code,message);
    local_ba = 0;
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_d8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ConfidentialAssetId::ConfidentialAssetId(__return_storage_ptr__,&local_d8);
  ByteData::~ByteData((ByteData *)0x4af1f9);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ConfidentialAssetId ConfidentialTransaction::CalculateAsset(
    const BlindFactor &entropy) {
  const std::vector<uint8_t> &entropy_byte = entropy.GetData().GetBytes();

  std::vector<uint8_t> asset(kAssetSize);
  int ret = wally_tx_elements_issuance_calculate_asset(
      entropy_byte.data(), entropy_byte.size(), asset.data(), asset.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_issuance_calculate_asset NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "asset calculate error.");
  }

  return ConfidentialAssetId(ByteData(asset));
}